

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void * __thiscall asmjit::ZoneHeap::_alloc(ZoneHeap *this,size_t size,size_t *allocatedSize)

{
  Zone *this_00;
  DynamicBlock *pDVar1;
  Slot *pSVar2;
  int iVar3;
  DynamicBlock *pDVar4;
  Slot *pSVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  ulong size_00;
  Slot *pSVar9;
  ulong uVar10;
  uint uVar11;
  
  this_00 = this->_zone;
  if (this_00 == (Zone *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
               ,0xe9,"isInitialized()");
  }
  if (size == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
               ,0x167,"size > 0");
  }
  if (0x200 < size) {
    if (0xffffffffffffffc6 < size) {
      return (void *)0x0;
    }
    pDVar4 = (DynamicBlock *)malloc(size + 0x38);
    if (pDVar4 == (DynamicBlock *)0x0) {
      size = 0;
      pvVar6 = (void *)0x0;
    }
    else {
      pDVar1 = this->_dynamicBlocks;
      if (pDVar1 != (DynamicBlock *)0x0) {
        pDVar1->prev = pDVar4;
      }
      pDVar4->prev = (DynamicBlock *)0x0;
      pDVar4->next = pDVar1;
      this->_dynamicBlocks = pDVar4;
      pvVar6 = (void *)((ulong)((long)&pDVar4[3].prev + 7U) & 0xffffffffffffffe0);
      *(DynamicBlock **)((long)pvVar6 - 8) = pDVar4;
    }
    *allocatedSize = size;
    return pvVar6;
  }
  if (size < 0x81) {
    uVar8 = 0x1e0;
    uVar11 = (uint)(size + 0x1fffffffff >> 5);
    iVar3 = 0x1f;
  }
  else {
    uVar8 = 0x7c0;
    uVar11 = (int)(size + 0x3fffffff7f >> 6) + 4;
    iVar3 = 0x3f;
  }
  size_00 = (ulong)(uVar8 & iVar3 + (int)size);
  *allocatedSize = size_00;
  pSVar2 = this->_slots[uVar11];
  if (pSVar2 != (Slot *)0x0) {
    this->_slots[uVar11] = pSVar2->next;
    return pSVar2;
  }
  pSVar2 = (Slot *)this_00->_end;
  pSVar5 = (Slot *)((ulong)((long)&((Slot *)this_00->_ptr)[3].next + 7) & 0xffffffffffffffe0);
  uVar7 = (long)pSVar2 - (long)pSVar5;
  if (pSVar2 < pSVar5) {
    if (size_00 != 0) goto LAB_001531bf;
  }
  else if (uVar7 < size_00) {
    if (uVar7 < 0x20) {
LAB_001531bf:
      pvVar6 = Zone::_alloc(this_00,size_00);
      if (pvVar6 == (void *)0x0) {
        *allocatedSize = 0;
        return (void *)0x0;
      }
      return pvVar6;
    }
    do {
      uVar10 = 0x80;
      if (uVar7 < 0x80) {
        uVar10 = uVar7;
      }
      uVar7 = uVar7 - uVar10;
      uVar11 = (int)uVar10 + 0x60U >> 5 & 3;
      pSVar5->next = this->_slots[uVar11];
      this->_slots[uVar11] = pSVar5;
      pSVar5 = (Slot *)((long)&pSVar5->next + uVar10);
    } while (0x1f < uVar7);
    if (((Slot *)this_00->_ptr <= pSVar5) && (pSVar5 <= (Slot *)this_00->_end)) {
      this_00->_ptr = (uint8_t *)pSVar5;
      goto LAB_001531bf;
    }
    goto LAB_001531d8;
  }
  pSVar9 = (Slot *)((long)&pSVar5->next + size_00);
  if (((Slot *)this_00->_ptr <= pSVar9) && (pSVar9 <= pSVar2)) {
    this_00->_ptr = (uint8_t *)pSVar9;
    return pSVar5;
  }
LAB_001531d8:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
             ,0x6b,"p >= _ptr && p <= _end");
}

Assistant:

void* ZoneHeap::_alloc(size_t size, size_t& allocatedSize) noexcept {
  ASMJIT_ASSERT(isInitialized());

  // We use our memory pool only if the requested block is of a reasonable size.
  uint32_t slot;
  if (_getSlotIndex(size, slot, allocatedSize)) {
    // Slot reuse.
    uint8_t* p = reinterpret_cast<uint8_t*>(_slots[slot]);
    size = allocatedSize;

    if (p) {
      _slots[slot] = reinterpret_cast<Slot*>(p)->next;
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }

    // So use Zone to allocate a new chunk for us. But before we use it, we
    // check if there is enough room for the new chunk in zone, and if not,
    // we redistribute the remaining memory in Zone's current block into slots.
    Zone* zone = _zone;
    p = Utils::alignTo(zone->getCursor(), kBlockAlignment);
    size_t remain = (p <= zone->getEnd()) ? (size_t)(zone->getEnd() - p) : size_t(0);

    if (ASMJIT_LIKELY(remain >= size)) {
      zone->setCursor(p + size);
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
    else {
      // Distribute the remaining memory to suitable slots.
      if (remain >= kLoGranularity) {
        do {
          size_t distSize = std::min<size_t>(remain, kLoMaxSize);
          uint32_t distSlot = static_cast<uint32_t>((distSize - kLoGranularity) / kLoGranularity);
          ASMJIT_ASSERT(distSlot < kLoCount);

          reinterpret_cast<Slot*>(p)->next = _slots[distSlot];
          _slots[distSlot] = reinterpret_cast<Slot*>(p);

          p += distSize;
          remain -= distSize;
        } while (remain >= kLoGranularity);
        zone->setCursor(p);
      }

      p = static_cast<uint8_t*>(zone->_alloc(size));
      if (ASMJIT_UNLIKELY(!p)) {
        allocatedSize = 0;
        return nullptr;
      }

      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
  }
  else {
    // Allocate a dynamic block.
    size_t overhead = sizeof(DynamicBlock) + sizeof(DynamicBlock*) + kBlockAlignment;

    // Handle a possible overflow.
    if (ASMJIT_UNLIKELY(overhead >= ~static_cast<size_t>(0) - size))
      return nullptr;

    void* p = Internal::allocMemory(size + overhead);
    if (ASMJIT_UNLIKELY(!p)) {
      allocatedSize = 0;
      return nullptr;
    }

    // Link as first in `_dynamicBlocks` double-linked list.
    DynamicBlock* block = static_cast<DynamicBlock*>(p);
    DynamicBlock* next = _dynamicBlocks;

    if (next)
      next->prev = block;

    block->prev = nullptr;
    block->next = next;
    _dynamicBlocks = block;

    // Align the pointer to the guaranteed alignment and store `DynamicBlock`
    // at the end of the memory block, so `_releaseDynamic()` can find it.
    p = Utils::alignTo(static_cast<uint8_t*>(p) + sizeof(DynamicBlock) + sizeof(DynamicBlock*), kBlockAlignment);
    reinterpret_cast<DynamicBlock**>(p)[-1] = block;

    allocatedSize = size;
    //printf("ALLOCATED DYNAMIC %p of size %d\n", p, int(size));
    return p;
  }
}